

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emithelper.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseEmitHelper::emitArgsAssignment
          (BaseEmitHelper *this,FuncFrame *frame,FuncArgsAssignment *args)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  Error EVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  Error EVar16;
  int iVar17;
  long lVar18;
  ArchTraits *this_00;
  ulong uVar19;
  uint uVar20;
  RegInfo *pRVar21;
  ulong uVar22;
  ArchTraits *pAVar23;
  ulong uVar24;
  uint32_t uVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  byte bVar29;
  char cVar30;
  Error local_3fc;
  uint32_t local_3d8;
  uint local_3d4;
  long local_3d0;
  BaseReg dstReg;
  uint32_t local_3a8;
  uint local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  long local_398;
  ulong local_390;
  ulong local_388;
  RegInfo *local_380;
  ulong local_378;
  FuncFrame *local_370;
  RAConstraints constraints;
  FuncArgsContext ctx;
  
  bVar29 = frame->_arch;
  constraints._availableRegs[0] = 0;
  constraints._availableRegs[1] = 0;
  constraints._availableRegs[2] = 0;
  constraints._availableRegs[3] = 0;
  FuncArgsContext::FuncArgsContext(&ctx);
  EVar7 = RAConstraints::init(&constraints,(EVP_PKEY_CTX *)(ulong)(uint)bVar29);
  if (EVar7 != 0) {
    return EVar7;
  }
  EVar7 = FuncArgsContext::initWorkData(&ctx,frame,args,&constraints);
  lVar15 = CONCAT44(local_3a4,local_39c);
  if (EVar7 != 0) {
    return EVar7;
  }
  lVar18 = (ulong)(bVar29 & 0x7f) * 0xd4;
  this_00 = (ArchTraits *)(_archTraits + lVar18);
  uVar26 = (ulong)ctx._varCount;
  local_378 = (ulong)ctx._saVarId;
  bVar2 = this_00->_spRegId;
  uVar13 = (uint)bVar2;
  if (frame->_minDynamicAlignment <= frame->_finalStackAlignment) {
    if ((frame->_attributes & 0x10) == 0) {
      if (ctx._saVarId < ctx._varCount) {
        uVar13 = (uint)*(byte *)((long)&ctx._vars[local_378].cur._data + 2);
      }
      else {
        uVar13 = (uint)frame->_saRegId;
      }
    }
    else {
      uVar13 = (uint)(byte)_archTraits[lVar18 + 1];
    }
  }
  uVar20 = (this->_emitter->_gpRegInfo)._signature;
  local_388 = (ulong)uVar20;
  local_3fc = 0;
  local_370 = frame;
  if (ctx._stackDstMask != '\0') {
    uVar10 = frame->_dirtyRegs[(ulong)(uVar13 != frame->_spRegId) - 3];
    uVar20 = uVar20 & 0xf8;
    uVar25 = uVar20 + 2;
    local_390 = CONCAT44(uVar13,uVar10);
    local_398 = CONCAT44(local_398._4_4_,(uint)((bVar29 & 1) == 0) * 4 + 4);
    local_380 = (RegInfo *)(_archTraits + lVar18 + 0x48);
    uVar27 = 0;
    while( true ) {
      bVar29 = 8;
      if (uVar26 == uVar27) break;
      uVar12 = ctx._vars[uVar27].out._data;
      EVar7 = local_3fc;
      if ((uVar12 >> 9 & 1) != 0) {
        uVar14 = ctx._vars[uVar27].cur._data;
        if ((uVar14 & 0x300) == 0) {
LAB_00118a76:
          local_3a4 = (uint)((ulong)lVar15 >> 0x20);
          local_39c = (undefined4)lVar15;
          emitArgsAssignment();
          if (uVar20 - 1 < 2) {
            uVar10 = 0xff;
            uVar13 = 0xffff;
            if (uVar20 == 1) {
              uVar13 = 0xff;
            }
            uVar20 = uVar13 & 0xffffffef;
          }
          else {
            if (uVar20 != 6) {
              return 4;
            }
            uVar10 = 0;
            uVar13 = 0xffffffff;
            uVar20 = 0x7ffbffff;
          }
          ((ArchTraits *)frame)->_spRegId = (char)uVar20;
          ((ArchTraits *)frame)->_fpRegId = (char)(uVar20 >> 8);
          ((ArchTraits *)frame)->_linkRegId = (char)(uVar20 >> 0x10);
          ((ArchTraits *)frame)->_ipRegId = (char)(uVar20 >> 0x18);
          ((ArchTraits *)frame)->_reserved[0] = (char)uVar13;
          ((ArchTraits *)frame)->_reserved[1] = (char)(uVar13 >> 8);
          ((ArchTraits *)frame)->_reserved[2] = (char)(uVar13 >> 0x10);
          ((ArchTraits *)frame)->_hwStackAlignment = (char)(uVar13 >> 0x18);
          ((ArchTraits *)frame)->_minStackOffset = uVar10;
          ((ArchTraits *)frame)->_maxStackOffset = uVar10;
          return 0;
        }
        dstReg.super_Operand.super_Operand_._signature = 1;
        dstReg.super_Operand.super_Operand_._baseId = 0xff;
        dstReg.super_Operand.super_Operand_._data[0] = 0;
        dstReg.super_Operand.super_Operand_._data[1] = 0;
        local_3d4 = (uint)bVar2;
        local_3d0 = (ulong)(uint)((int)uVar12 >> 0xc) << 0x20;
        if (uVar20 == 0) {
          local_3d4 = ((int)uVar12 >> 0x1f) + local_3d4;
        }
        local_3a0 = 0;
        if (uVar20 == 0) {
          lVar15 = (long)((int)uVar14 >> 0xc) + local_390;
        }
        else {
          lVar15 = CONCAT44(uVar13,((int)uVar14 >> 0xc) + uVar10);
        }
        local_3a4 = (uint)((ulong)lVar15 >> 0x20);
        local_39c = (undefined4)lVar15;
        local_3d8 = uVar25;
        local_3a8 = uVar25;
        if ((uVar14 >> 10 & 1) != 0) {
          EVar7 = 0x1a;
          bVar29 = 1;
          if ((uVar14 >> 9 & 1) != 0) goto LAB_00118413;
          local_3a4 = uVar14 >> 0x10 & 0xff;
        }
        if ((uVar14 & 0x500) == 0x100) {
          uVar8 = ArchTraits::regTypeToGroup(this_00,uVar14 >> 0x18);
          uVar12 = ctx._vars[uVar27].cur._data;
          uVar14 = uVar12 >> 0x10;
          uVar9 = ArchTraits::regTypeToSignature(this_00,uVar12 >> 0x18);
          dstReg.super_Operand.super_Operand_._0_8_ = CONCAT44(uVar14,uVar9) & 0xffffffffff;
          FuncArgsContext::WorkData::unassign
                    ((WorkData *)&ctx._workData[uVar8]._archRegs,(uint32_t)uVar27,uVar14 & 0xff);
        }
        else {
          uVar19 = (ulong)uVar12 & 0xff;
          uVar24 = (ulong)uVar14 & 0xff;
          bVar29 = Type::_typeData[uVar24 + 0x100];
          if ((byte)Type::_typeData[uVar24 + 0x100] < (byte)Type::_typeData[uVar19 + 0x100]) {
            bVar29 = Type::_typeData[uVar19 + 0x100];
          }
          if (((uint)local_398 < bVar29) && ((9 < (int)uVar19 - 0x20U || (9 < (int)uVar24 - 0x20U)))
             ) {
            if ((((8 < bVar29) || (uVar12 = *(uint *)(_archTraits + lVar18 + 0x3c), uVar12 == 0)) &&
                ((0x10 < bVar29 || (uVar12 = *(uint *)(_archTraits + lVar18 + 0x40), uVar12 == 0))))
               && (((0x20 < bVar29 || (uVar12 = *(uint *)(_archTraits + lVar18 + 0x44), uVar12 == 0)
                    ) && (uVar12 = 0, pRVar21 = local_380, bVar29 < 0x41)))) goto LAB_0011833f;
          }
          else {
            pRVar21 = this_00->_regInfo + (ulong)(4 < bVar29) + 5;
LAB_0011833f:
            uVar12 = pRVar21->_signature;
          }
          if (uVar12 == 0) {
LAB_00118472:
            bVar28 = false;
            local_3fc = 3;
          }
          else {
            uVar22 = (ulong)(uVar12 >> 2 & 0x3c0);
            frame = (FuncFrame *)ctx._workData;
            uVar14 = ~*(uint *)(ctx._workData[0]._reserved + (uVar22 - 0xe)) &
                     *(uint *)(ctx._workData[0]._reserved + (uVar22 - 0x16));
            if (uVar14 == 0) goto LAB_00118472;
            dstReg.super_Operand.super_Operand_._baseId = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> dstReg.super_Operand.super_Operand_._baseId & 1) == 0;
                  dstReg.super_Operand.super_Operand_._baseId =
                       dstReg.super_Operand.super_Operand_._baseId + 1) {
              }
            }
            dstReg.super_Operand.super_Operand_._signature = uVar12;
            frame = (FuncFrame *)this;
            EVar7 = (*this->_vptr_BaseEmitHelper[2])(this,&dstReg,uVar19,&local_3a8,uVar24,0);
            bVar28 = EVar7 == 0;
            if (!bVar28) {
              local_3fc = EVar7;
            }
          }
          lVar15 = CONCAT44(local_3a4,local_39c);
          bVar29 = 1;
          EVar7 = local_3fc;
          if (!bVar28) goto LAB_00118413;
        }
        uVar12 = ctx._vars[uVar27].cur._data;
        if ((~uVar12 & 0x500) == 0) {
          FuncArgsContext::WorkData::unassign(ctx._workData,(uint32_t)uVar27,uVar12 >> 0x10 & 0xff);
        }
        frame = (FuncFrame *)this;
        EVar7 = (**this->_vptr_BaseEmitHelper)
                          (this,&local_3d8,&dstReg,(ulong)(byte)ctx._vars[uVar27].cur._data,0);
        lVar15 = CONCAT44(local_3a4,local_39c);
        bVar29 = EVar7 != 0;
        if (!(bool)bVar29) {
          pbVar1 = (byte *)((long)&ctx._vars[uVar27].cur._data + 1);
          *pbVar1 = *pbVar1 | 8;
          EVar7 = local_3fc;
        }
      }
LAB_00118413:
      local_3fc = EVar7;
      if ((bVar29 & 7) != 0) goto LAB_0011847f;
      uVar27 = uVar27 + 1;
    }
    bVar29 = 6;
LAB_0011847f:
    if ((bVar29 != 6) && (bVar29 != 0)) {
      return local_3fc;
    }
  }
  uVar20 = 0;
  do {
    bVar28 = false;
    uVar27 = 0;
    while( true ) {
      local_3a4 = (uint)((ulong)lVar15 >> 0x20);
      local_39c = (undefined4)lVar15;
      if (uVar26 == uVar27) break;
      uVar12 = ctx._vars[uVar27].cur._data;
      if ((uVar12 & 0x900) == 0x100) {
        uVar10 = ArchTraits::regTypeToGroup(this_00,uVar12 >> 0x18);
        frame = (FuncFrame *)this_00;
        uVar25 = ArchTraits::regTypeToGroup
                           (this_00,(uint)*(byte *)((long)&ctx._vars[uVar27].out._data + 3));
        lVar15 = CONCAT44(local_3a4,local_39c);
        if (uVar10 == uVar25) {
          uVar14 = (uint)*(byte *)((long)&ctx._vars[uVar27].cur._data + 2);
          bVar29 = *(byte *)((long)&ctx._vars[uVar27].out._data + 2);
          uVar12 = (uint)bVar29;
          pAVar23 = (ArchTraits *)&ctx._workData[uVar25]._archRegs;
          frame = (FuncFrame *)pAVar23;
          bVar6 = FuncArgsContext::WorkData::isAssigned((WorkData *)pAVar23,(uint)bVar29);
          if (bVar6) {
            bVar2 = ctx._workData[uVar25]._physToVarId[bVar29];
            uVar12 = ctx._vars[bVar2].out._data;
            if ((uVar12 == 0) || (((uVar12 >> 8 & 1) != 0 && ((uVar12 >> 0x10 & 0xff) == uVar14))))
            {
              if ((*(byte *)(lVar18 + 0x139010 + (ulong)uVar10) & 1) == 0) {
                EVar16 = ~ctx._workData[uVar25]._assignedRegs & ctx._workData[uVar25]._workRegs;
                if (EVar16 == 0) {
                  bVar28 = true;
                  cVar30 = '\0';
                  uVar12 = (uint)bVar29;
                }
                else {
                  uVar11 = ~ctx._workData[uVar25]._dstRegs & EVar16;
                  if (uVar11 == 0) {
                    uVar11 = EVar16;
                  }
                  uVar12 = 0;
                  if (uVar11 != 0) {
                    for (; (uVar11 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  cVar30 = '\x14';
                }
              }
              else {
                bVar3 = *(byte *)((long)&ctx._vars[uVar27].cur._data + 3);
                bVar4 = *(byte *)((long)&ctx._vars[bVar2].cur._data + 3);
                if (bVar3 <= bVar4) {
                  bVar3 = bVar4;
                }
                uVar10 = 5;
                if (2 < bVar3 - 2) {
                  uVar10 = (uint)bVar3;
                }
                local_3d8 = ArchTraits::regTypeToSignature(this_00,uVar10);
                dstReg.super_Operand.super_Operand_._baseId._0_1_ = bVar29;
                dstReg.super_Operand.super_Operand_._signature = local_3d8;
                dstReg.super_Operand.super_Operand_._baseId._1_3_ = 0;
                dstReg.super_Operand.super_Operand_._data[0] = 0;
                dstReg.super_Operand.super_Operand_._data[1] = 0;
                local_3d0 = 0;
                frame = (FuncFrame *)this;
                local_3d4 = uVar14;
                EVar16 = (*this->_vptr_BaseEmitHelper[1])(this,&dstReg,&local_3d8,0);
                EVar7 = EVar16;
                if (EVar16 == 0) {
                  frame = (FuncFrame *)pAVar23;
                  FuncArgsContext::WorkData::swap
                            ((WorkData *)pAVar23,(uint32_t)uVar27,uVar14,(uint)bVar2,(uint)bVar29);
                  ctx._vars[uVar27].cur._data =
                       (uint)bVar29 * 0x10000 + (ctx._vars[uVar27].cur._data & 0xff00f7ff) + 0x800;
                  uVar12 = ctx._vars[bVar2].cur._data & 0xff00ffff | uVar14 << 0x10;
                  ctx._vars[bVar2].cur._data = uVar12;
                  if (ctx._vars[bVar2].out._data != 0) {
                    ctx._vars[bVar2].cur._data = uVar12 | 0x800;
                  }
                  uVar20 = uVar20 | 1;
                  EVar7 = local_3fc;
                }
                cVar30 = '\x01';
                uVar12 = (uint)bVar29;
                local_3fc = EVar7;
              }
              if (EVar16 == 0) goto LAB_001185a9;
            }
            else {
              bVar28 = true;
              uVar12 = (uint)bVar29;
LAB_001185a9:
              cVar30 = '\0';
            }
            lVar15 = CONCAT44(local_3a4,local_39c);
            if (cVar30 != '\x14') goto LAB_0011869a;
          }
          dstReg.super_Operand.super_Operand_._signature =
               ArchTraits::regTypeToSignature
                         (this_00,(uint)*(byte *)((long)&ctx._vars[uVar27].out._data + 3));
          dstReg.super_Operand.super_Operand_._baseId = uVar12;
          dstReg.super_Operand.super_Operand_._data[0] = 0;
          dstReg.super_Operand.super_Operand_._data[1] = 0;
          uVar10 = ctx._vars[uVar27].out._data;
          local_3d8 = ArchTraits::regTypeToSignature
                                (this_00,(uint)*(byte *)((long)&ctx._vars[uVar27].cur._data + 3));
          local_3d0 = 0;
          frame = (FuncFrame *)this;
          local_3d4 = uVar14;
          EVar7 = (*this->_vptr_BaseEmitHelper[2])
                            (this,&dstReg,(ulong)(byte)uVar10,&local_3d8,
                             (ulong)(byte)ctx._vars[uVar27].cur._data,0);
          cVar30 = EVar7 != 0;
          if (!(bool)cVar30) {
            FuncArgsContext::WorkData::reassign((WorkData *)pAVar23,(uint32_t)uVar27,uVar12,uVar14);
            uVar14 = ctx._vars[uVar27].out._data;
            ctx._vars[uVar27].cur._data =
                 (uint)(uVar12 == (uVar14 >> 0x10 & 0xff)) * 0x800 +
                 (uVar14 & 0xff0000ff | uVar12 << 0x10) + 0x100;
            uVar20 = uVar20 | 3;
            bVar28 = true;
            frame = (FuncFrame *)pAVar23;
            EVar7 = local_3fc;
          }
          local_3fc = EVar7;
          lVar15 = CONCAT44(local_3a4,local_39c);
        }
        else {
          cVar30 = '\x01';
          local_3fc = 0x1a;
        }
      }
      else {
        cVar30 = '\x13';
      }
LAB_0011869a:
      if ((cVar30 != '\x13') && (cVar30 != '\0')) break;
      uVar27 = uVar27 + 1;
    }
    if (uVar27 < uVar26) {
      return local_3fc;
    }
    if (!bVar28) {
      if (ctx._hasStackSrc != true) goto LAB_00118a6a;
      if ((local_370->_minDynamicAlignment <= local_370->_finalStackAlignment) &&
         ((local_370->_attributes & 0x10) == 0)) {
        if ((uint)local_378 < ctx._varCount) {
          bVar29 = *(byte *)((long)&ctx._vars[local_378 & 0xffffffff].cur._data + 2);
        }
        else {
          bVar29 = local_370->_saRegId;
        }
        uVar13 = (uint)bVar29;
      }
      uVar10 = local_370->_dirtyRegs[(ulong)(uVar13 != local_370->_spRegId) - 3];
      uVar14 = (uint)local_388 & 0xf8;
      local_388 = (ulong)uVar14;
      local_398 = CONCAT44(uVar13,uVar10);
      local_390 = 0;
      uVar12 = 1;
      break;
    }
    if ((uVar20 & 5) == 4) {
      return 3;
    }
    uVar20 = (~uVar20 & 1) << 2;
  } while( true );
  do {
    if (uVar12 <= (uint)local_390) {
      cVar30 = '\x19';
      break;
    }
    uVar27 = 0;
    while( true ) {
      local_3a4 = (uint)((ulong)lVar15 >> 0x20);
      local_39c = (undefined4)lVar15;
      uVar20 = 0x1e;
      if (uVar26 == uVar27) break;
      uVar11 = ctx._vars[uVar27].cur._data;
      if ((uVar11 >> 0xb & 1) == 0) {
        cVar30 = '\0';
        if ((uVar11 >> 9 & 1) != 0) {
          uVar11 = ctx._vars[uVar27].out._data;
          if ((uVar11 >> 8 & 1) == 0) {
            emitArgsAssignment();
            lVar15 = CONCAT44(local_3a4,local_39c);
            goto LAB_00118a76;
          }
          uVar20 = uVar11 >> 0x10 & 0xff;
          frame = (FuncFrame *)this_00;
          uVar25 = ArchTraits::regTypeToGroup(this_00,uVar11 >> 0x18);
          lVar15 = CONCAT44(local_3a4,local_39c);
          pAVar23 = (ArchTraits *)&ctx._workData[uVar25]._archRegs;
          if ((uVar20 == uVar13) && (uVar25 == 0)) {
            if (uVar12 == 1) {
              uVar12 = 2;
              cVar30 = '\x1e';
              goto LAB_00118a34;
            }
            FuncArgsContext::WorkData::unassign
                      ((WorkData *)pAVar23,(uint)ctx._workData[uVar25]._physToVarId[uVar20],uVar20);
          }
          uVar25 = ArchTraits::regTypeToSignature(this_00,uVar11 >> 0x18);
          dstReg.super_Operand.super_Operand_._0_8_ = CONCAT44(uVar11 >> 0x10,uVar25) & 0xffffffffff
          ;
          dstReg.super_Operand.super_Operand_._data[0] = 0;
          dstReg.super_Operand.super_Operand_._data[1] = 0;
          uVar5 = ctx._vars[uVar27].cur._data;
          iVar17 = (int)uVar5 >> 0xc;
          if ((int)local_388 == 0) {
            local_3d0 = iVar17 + local_398;
          }
          else {
            local_3d0 = CONCAT44(uVar13,iVar17 + uVar10);
          }
          local_3d4 = (uint)((ulong)local_3d0 >> 0x20);
          local_3d0 = local_3d0 << 0x20;
          frame = (FuncFrame *)this;
          local_3d8 = uVar14 + 2;
          EVar7 = (*this->_vptr_BaseEmitHelper[2])
                            (this,&dstReg,(ulong)(byte)ctx._vars[uVar27].out._data,&local_3d8,
                             (ulong)(uVar5 & 0xff),0);
          if (EVar7 != 0) {
            local_3fc = EVar7;
          }
          bVar28 = EVar7 == 0;
          if (bVar28) {
            FuncArgsContext::WorkData::assign((WorkData *)pAVar23,(uint32_t)uVar27,uVar20);
            ctx._vars[uVar27].cur._data =
                 (uint)(byte)ctx._vars[uVar27].cur._data + (uVar20 << 0x10 | uVar11 & 0xff000000) +
                 0x900;
            frame = (FuncFrame *)pAVar23;
          }
          lVar15 = CONCAT44(local_3a4,local_39c);
          cVar30 = !bVar28;
        }
      }
      else {
        cVar30 = '\x1e';
      }
LAB_00118a34:
      if ((cVar30 != '\x1e') && (cVar30 != '\0')) goto LAB_00118a48;
      uVar27 = uVar27 + 1;
    }
    cVar30 = '\x1c';
LAB_00118a48:
    local_390 = (ulong)((int)local_390 + 1);
  } while (cVar30 == '\x1c');
  if ((cVar30 == '\x19') || (cVar30 == '\0')) {
LAB_00118a6a:
    local_3fc = 0;
  }
  return local_3fc;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseEmitHelper::emitArgsAssignment(const FuncFrame& frame, const FuncArgsAssignment& args) {
  typedef FuncArgsContext::Var Var;
  typedef FuncArgsContext::WorkData WorkData;

  enum WorkFlags : uint32_t {
    kWorkNone      = 0x00,
    kWorkDidSome   = 0x01,
    kWorkPending   = 0x02,
    kWorkPostponed = 0x04
  };

  uint32_t arch = frame.arch();
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  RAConstraints constraints;
  FuncArgsContext ctx;

  ASMJIT_PROPAGATE(constraints.init(arch));
  ASMJIT_PROPAGATE(ctx.initWorkData(frame, args, &constraints));

#ifdef ASMJIT_DUMP_ARGS_ASSIGNMENT
  {
    String sb;
    dumpAssignment(sb, ctx);
    printf("%s\n", sb.data());
  }
#endif

  uint32_t varCount = ctx._varCount;
  WorkData* workData = ctx._workData;

  uint32_t saVarId = ctx._saVarId;
  BaseReg sp = BaseReg::fromSignatureAndId(_emitter->_gpRegInfo.signature(), archTraits.spRegId());
  BaseReg sa = sp;

  if (frame.hasDynamicAlignment()) {
    if (frame.hasPreservedFP())
      sa.setId(archTraits.fpRegId());
    else
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());
  }

  // --------------------------------------------------------------------------
  // Register to stack and stack to stack moves must be first as now we have
  // the biggest chance of having as many as possible unassigned registers.
  // --------------------------------------------------------------------------

  if (ctx._stackDstMask) {
    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));
    BaseMem baseStackPtr(sp, 0);

    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];

      if (!var.out.isStack())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      ASMJIT_ASSERT(cur.isReg() || cur.isStack());
      BaseReg reg;

      BaseMem dstStackPtr = baseStackPtr.cloneAdjusted(out.stackOffset());
      BaseMem srcStackPtr = baseArgPtr.cloneAdjusted(cur.stackOffset());

      if (cur.isIndirect()) {
        if (cur.isStack()) {
          // TODO: Indirect stack.
          return DebugUtils::errored(kErrorInvalidAssignment);
        }
        else {
          srcStackPtr.setBaseId(cur.regId());
        }
      }

      if (cur.isReg() && !cur.isIndirect()) {
        WorkData& wd = workData[archTraits.regTypeToGroup(cur.regType())];
        uint32_t rId = cur.regId();

        reg.setSignatureAndId(archTraits.regTypeToSignature(cur.regType()), rId);
        wd.unassign(varId, rId);
      }
      else {
        // Stack to reg move - tricky since we move stack to stack we can decide which
        // register to use. In general we follow the rule that IntToInt moves will use
        // GP regs with possibility to signature or zero extend, and all other moves will
        // either use GP or VEC regs depending on the size of the move.
        RegInfo rInfo = getSuitableRegForMemToMemMove(arch, out.typeId(), cur.typeId());
        if (ASMJIT_UNLIKELY(!rInfo.isValid()))
          return DebugUtils::errored(kErrorInvalidState);

        WorkData& wd = workData[rInfo.group()];
        uint32_t availableRegs = wd.availableRegs();
        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorInvalidState);

        uint32_t rId = Support::ctz(availableRegs);
        reg.setSignatureAndId(rInfo.signature(), rId);

        ASMJIT_PROPAGATE(emitArgMove(reg, out.typeId(), srcStackPtr, cur.typeId()));
      }

      if (cur.isIndirect() && cur.isReg())
        workData[BaseReg::kGroupGp].unassign(varId, cur.regId());

      // Register to stack move.
      ASMJIT_PROPAGATE(emitRegMove(dstStackPtr, reg, cur.typeId()));
      var.markDone();
    }
  }

  // --------------------------------------------------------------------------
  // Shuffle all registers that are currently assigned accordingly to target
  // assignment.
  // --------------------------------------------------------------------------

  uint32_t workFlags = kWorkNone;
  for (;;) {
    for (uint32_t varId = 0; varId < varCount; varId++) {
      Var& var = ctx._vars[varId];
      if (var.isDone() || !var.cur.isReg())
        continue;

      FuncValue& cur = var.cur;
      FuncValue& out = var.out;

      uint32_t curGroup = archTraits.regTypeToGroup(cur.regType());
      uint32_t outGroup = archTraits.regTypeToGroup(out.regType());

      uint32_t curId = cur.regId();
      uint32_t outId = out.regId();

      if (curGroup != outGroup) {
        // TODO: Conversion is not supported.
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
      else {
        WorkData& wd = workData[outGroup];
        if (!wd.isAssigned(outId)) {
EmitMove:
          ASMJIT_PROPAGATE(
            emitArgMove(
              BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(out.regType()), outId), out.typeId(),
              BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(cur.regType()), curId), cur.typeId()));

          wd.reassign(varId, outId, curId);
          cur.initReg(out.regType(), outId, out.typeId());

          if (outId == out.regId())
            var.markDone();
          workFlags |= kWorkDidSome | kWorkPending;
        }
        else {
          uint32_t altId = wd._physToVarId[outId];
          Var& altVar = ctx._vars[altId];

          if (!altVar.out.isInitialized() || (altVar.out.isReg() && altVar.out.regId() == curId)) {
            // Only few architectures provide swap operations, and only for few register groups.
            if (archTraits.hasSwap(curGroup)) {
              uint32_t highestType = Support::max(cur.regType(), altVar.cur.regType());
              if (Support::isBetween<uint32_t>(highestType, BaseReg::kTypeGp8Lo, BaseReg::kTypeGp16))
                highestType = BaseReg::kTypeGp32;

              uint32_t signature = archTraits.regTypeToSignature(highestType);
              ASMJIT_PROPAGATE(
                emitRegSwap(BaseReg::fromSignatureAndId(signature, outId),
                            BaseReg::fromSignatureAndId(signature, curId)));
              wd.swap(varId, curId, altId, outId);
              cur.setRegId(outId);
              var.markDone();
              altVar.cur.setRegId(curId);

              if (altVar.out.isInitialized())
                altVar.markDone();
              workFlags |= kWorkDidSome;
            }
            else {
              // If there is a scratch register it can be used to perform the swap.
              uint32_t availableRegs = wd.availableRegs();
              if (availableRegs) {
                uint32_t inOutRegs = wd.dstRegs();
                if (availableRegs & ~inOutRegs)
                  availableRegs &= ~inOutRegs;
                outId = Support::ctz(availableRegs);
                goto EmitMove;
              }
              else {
                workFlags |= kWorkPending;
              }
            }
          }
          else {
            workFlags |= kWorkPending;
          }
        }
      }
    }

    if (!(workFlags & kWorkPending))
      break;

    // If we did nothing twice it means that something is really broken.
    if ((workFlags & (kWorkDidSome | kWorkPostponed)) == kWorkPostponed)
      return DebugUtils::errored(kErrorInvalidState);

    workFlags = (workFlags & kWorkDidSome) ? kWorkNone : kWorkPostponed;
  }

  // --------------------------------------------------------------------------
  // Load arguments passed by stack into registers. This is pretty simple and
  // it never requires multiple iterations like the previous phase.
  // --------------------------------------------------------------------------

  if (ctx._hasStackSrc) {
    uint32_t iterCount = 1;
    if (frame.hasDynamicAlignment() && !frame.hasPreservedFP())
      sa.setId(saVarId < varCount ? ctx._vars[saVarId].cur.regId() : frame.saRegId());

    // Base address of all arguments passed by stack.
    BaseMem baseArgPtr(sa, int32_t(frame.saOffset(sa.id())));

    for (uint32_t iter = 0; iter < iterCount; iter++) {
      for (uint32_t varId = 0; varId < varCount; varId++) {
        Var& var = ctx._vars[varId];
        if (var.isDone())
          continue;

        if (var.cur.isStack()) {
          ASMJIT_ASSERT(var.out.isReg());

          uint32_t outId = var.out.regId();
          uint32_t outType = var.out.regType();

          uint32_t group = archTraits.regTypeToGroup(outType);
          WorkData& wd = ctx._workData[group];

          if (outId == sa.id() && group == BaseReg::kGroupGp) {
            // This register will be processed last as we still need `saRegId`.
            if (iterCount == 1) {
              iterCount++;
              continue;
            }
            wd.unassign(wd._physToVarId[outId], outId);
          }

          BaseReg dstReg = BaseReg::fromSignatureAndId(archTraits.regTypeToSignature(outType), outId);
          BaseMem srcMem = baseArgPtr.cloneAdjusted(var.cur.stackOffset());

          ASMJIT_PROPAGATE(emitArgMove(
            dstReg, var.out.typeId(),
            srcMem, var.cur.typeId()));

          wd.assign(varId, outId);
          var.cur.initReg(outType, outId, var.cur.typeId(), FuncValue::kFlagIsDone);
        }
      }
    }
  }

  return kErrorOk;
}